

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.cpp
# Opt level: O0

bool __thiscall argo::file_reader::read_next_block(file_reader *this)

{
  int iVar1;
  size_t sVar2;
  json_io_exception *this_00;
  int *piVar3;
  size_t n;
  file_reader *this_local;
  
  sVar2 = fread((this->super_reader).m_block,1,0x2000,(FILE *)this->m_file);
  if (sVar2 == 0) {
    iVar1 = ferror((FILE *)this->m_file);
    if (iVar1 != 0) {
      this_00 = (json_io_exception *)__cxa_allocate_exception(0xd8);
      piVar3 = __errno_location();
      json_io_exception::json_io_exception(this_00,read_failed_e,*piVar3);
      __cxa_throw(this_00,&json_io_exception::typeinfo,json_io_exception::~json_io_exception);
    }
    this_local._7_1_ = false;
  }
  else {
    (this->super_reader).m_block_num_bytes = (int)sVar2;
    (this->super_reader).m_block_index = 0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool file_reader::read_next_block()
{
    size_t n = fread(m_block, 1, block_size, m_file);

    if (n > 0)
    {
        m_block_num_bytes = static_cast<int>(n);
        m_block_index = 0;
        return true;
    }
    else
    {
        if (ferror(m_file))
        {
            throw json_io_exception(json_io_exception::read_failed_e, errno);
        }
        else
        {
            return false;
        }
    }
}